

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_event.cpp
# Opt level: O0

void __thiscall duckdb::PipelineEvent::Schedule(PipelineEvent *this)

{
  exception *ex;
  Executor *executor;
  shared_ptr<duckdb::Event,_true> event;
  shared_ptr<duckdb::Event,_true> *in_stack_fffffffffffffe68;
  Pipeline *in_stack_fffffffffffffe70;
  enable_shared_from_this<duckdb::Event> *in_stack_fffffffffffffe98;
  
  enable_shared_from_this<duckdb::Event>::shared_from_this(in_stack_fffffffffffffe98);
  shared_ptr<duckdb::Pipeline,_true>::operator->
            ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_fffffffffffffe70);
  shared_ptr<duckdb::Pipeline,_true>::operator->
            ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_fffffffffffffe70);
  Pipeline::Schedule(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x9981a5);
  return;
}

Assistant:

void PipelineEvent::Schedule() {
	auto event = shared_from_this();
	auto &executor = pipeline->executor;
	try {
		pipeline->Schedule(event);
		D_ASSERT(total_tasks > 0);
	} catch (std::exception &ex) {
		executor.PushError(ErrorData(ex));
	} catch (...) { // LCOV_EXCL_START
		executor.PushError(ErrorData("Unknown exception in Finalize!"));
	} // LCOV_EXCL_STOP
}